

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts_engine.c
# Opt level: O0

int main(int argc,char **argv)

{
  HTS_Boolean HVar1;
  int iVar2;
  FILE *fp;
  long *plVar3;
  long *in_RSI;
  int in_EDI;
  double dVar4;
  size_t num_interpolation_weights;
  FILE *tracefp;
  FILE *rawfp;
  FILE *wavfp;
  FILE *lpffp;
  FILE *lf0fp;
  FILE *mgcfp;
  FILE *durfp;
  char *labfn;
  char **fn_voices;
  size_t num_voices;
  HTS_Engine engine;
  double f;
  int i;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  HTS_Engine *in_stack_fffffffffffffdd0;
  HTS_Engine *in_stack_fffffffffffffde0;
  FILE *__stream;
  HTS_Engine *engine_00;
  FILE *__stream_00;
  HTS_Engine *engine_01;
  HTS_Engine *engine_02;
  FILE *local_1f0;
  FILE *__stream_01;
  HTS_Engine *engine_03;
  HTS_Engine *engine_04;
  FILE *in_stack_ffffffffffffff88;
  HTS_Engine *in_stack_ffffffffffffff90;
  int local_14;
  long *local_10;
  int local_8;
  
  engine_03 = (HTS_Engine *)0x0;
  __stream_01 = (FILE *)0x0;
  local_1f0 = (FILE *)0x0;
  engine_02 = (HTS_Engine *)0x0;
  engine_01 = (HTS_Engine *)0x0;
  __stream_00 = (FILE *)0x0;
  engine_00 = (HTS_Engine *)0x0;
  __stream = (FILE *)0x0;
  if (in_EDI < 2) {
    usage();
  }
  HTS_Engine_initialize((HTS_Engine *)0x1016e2);
  engine_04 = (HTS_Engine *)0x0;
  fp = (FILE *)malloc((long)in_EDI << 3);
  for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
    if ((*(char *)in_RSI[local_14] == '-') && (*(char *)(in_RSI[local_14] + 1) == 'm')) {
      local_14 = local_14 + 1;
      *(long *)(&fp->_flags + (long)engine_04 * 2) = in_RSI[local_14];
      engine_04 = (HTS_Engine *)((long)&(engine_04->condition).sampling_frequency + 1);
    }
    if ((*(char *)in_RSI[local_14] == '-') && (*(char *)(in_RSI[local_14] + 1) == 'h')) {
      usage();
    }
  }
  if (engine_04 == (HTS_Engine *)0x0) {
    fprintf(_stderr,"Error: HTS voice must be specified.\n");
    free(fp);
    exit(1);
  }
  HVar1 = HTS_Engine_load(engine_02,(char **)engine_01,(size_t)__stream_00);
  if (HVar1 != '\x01') {
    fprintf(_stderr,"Error: HTS voices cannot be loaded.\n");
    free(fp);
    HTS_Engine_clear(in_stack_fffffffffffffde0);
    exit(1);
  }
  free(fp);
  local_10 = in_RSI;
  local_8 = in_EDI;
  do {
    while( true ) {
      iVar2 = local_8 + -1;
      if (iVar2 == 0) {
        HVar1 = HTS_Engine_synthesize_from_fn
                          (in_stack_fffffffffffffdd0,
                           (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        if (HVar1 != '\x01') {
          fprintf(_stderr,"Error: waveform cannot be synthesized.\n");
          HTS_Engine_clear(in_stack_fffffffffffffde0);
          exit(1);
        }
        if (__stream != (FILE *)0x0) {
          HTS_Engine_save_information(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        if (__stream_01 != (FILE *)0x0) {
          HTS_Engine_save_label(engine_04,fp);
        }
        if (engine_00 != (HTS_Engine *)0x0) {
          HTS_Engine_save_generated_speech(engine_00,(FILE *)__stream);
        }
        if (__stream_00 != (FILE *)0x0) {
          HTS_Engine_save_riff(engine_03,(FILE *)__stream_01);
        }
        if (local_1f0 != (FILE *)0x0) {
          HTS_Engine_save_generated_parameter(engine_01,(size_t)__stream_00,(FILE *)engine_00);
        }
        if (engine_02 != (HTS_Engine *)0x0) {
          HTS_Engine_save_generated_parameter(engine_01,(size_t)__stream_00,(FILE *)engine_00);
        }
        if (engine_01 != (HTS_Engine *)0x0) {
          HTS_Engine_save_generated_parameter(engine_01,(size_t)__stream_00,(FILE *)engine_00);
        }
        HTS_Engine_refresh((HTS_Engine *)0x102190);
        HTS_Engine_clear(in_stack_fffffffffffffde0);
        if (__stream_01 != (FILE *)0x0) {
          fclose(__stream_01);
        }
        if (local_1f0 != (FILE *)0x0) {
          fclose(local_1f0);
        }
        if (engine_02 != (HTS_Engine *)0x0) {
          fclose((FILE *)engine_02);
        }
        if (engine_01 != (HTS_Engine *)0x0) {
          fclose((FILE *)engine_01);
        }
        if (__stream_00 != (FILE *)0x0) {
          fclose(__stream_00);
        }
        if (engine_00 != (HTS_Engine *)0x0) {
          fclose((FILE *)engine_00);
        }
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
        }
        return 0;
      }
      plVar3 = local_10 + 1;
      if (*(char *)local_10[1] == '-') break;
      engine_03 = (HTS_Engine *)*plVar3;
      local_10 = plVar3;
      local_8 = iVar2;
    }
    switch(*(undefined1 *)(*plVar3 + 1)) {
    case 0x61:
      dVar4 = atof((char *)local_10[2]);
      HTS_Engine_set_alpha((HTS_Engine *)&stack0xfffffffffffffe38,dVar4);
      local_8 = local_8 + -2;
      local_10 = local_10 + 2;
      break;
    case 0x62:
      dVar4 = atof((char *)local_10[2]);
      HTS_Engine_set_beta((HTS_Engine *)&stack0xfffffffffffffe38,dVar4);
      local_8 = local_8 + -2;
      local_10 = local_10 + 2;
      break;
    default:
      fprintf(_stderr,"Error: Invalid option \'-%c\'.\n",(ulong)(uint)(int)*(char *)(*plVar3 + 1));
      HTS_Engine_clear(in_stack_fffffffffffffde0);
      exit(1);
    case 0x66:
      if (*(char *)(*plVar3 + 2) != 'm') {
        fprintf(_stderr,"Error: Invalid option \'-f%c\'.\n",(ulong)(uint)(int)*(char *)(*plVar3 + 2)
               );
        HTS_Engine_clear(in_stack_fffffffffffffde0);
        exit(1);
      }
      dVar4 = atof((char *)local_10[2]);
      HTS_Engine_add_half_tone((HTS_Engine *)&stack0xfffffffffffffe38,dVar4);
      local_8 = local_8 + -2;
      local_10 = local_10 + 2;
      break;
    case 0x67:
      atof((char *)local_10[2]);
      HTS_Engine_set_volume
                (in_stack_fffffffffffffdd0,
                 (double)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      local_8 = local_8 + -2;
      local_10 = local_10 + 2;
      break;
    case 0x68:
      usage();
      local_10 = plVar3;
      local_8 = iVar2;
      break;
    case 0x69:
      iVar2 = atoi((char *)local_10[2]);
      in_stack_fffffffffffffde0 = (HTS_Engine *)(long)iVar2;
      local_8 = local_8 + -2;
      if (in_stack_fffffffffffffde0 != engine_04) {
        HTS_Engine_clear(in_stack_fffffffffffffde0);
        exit(1);
      }
      local_10 = local_10 + 2;
      for (local_14 = 0; (HTS_Engine *)(long)local_14 < in_stack_fffffffffffffde0;
          local_14 = local_14 + 1) {
        dVar4 = atof((char *)local_10[1]);
        local_8 = local_8 + -1;
        HTS_Engine_set_duration_interpolation_weight
                  ((HTS_Engine *)&stack0xfffffffffffffe38,(long)local_14,dVar4);
        HTS_Engine_set_parameter_interpolation_weight
                  ((HTS_Engine *)&stack0xfffffffffffffe38,(long)local_14,0,dVar4);
        HTS_Engine_set_parameter_interpolation_weight
                  ((HTS_Engine *)&stack0xfffffffffffffe38,(long)local_14,1,dVar4);
        HTS_Engine_set_gv_interpolation_weight
                  ((HTS_Engine *)&stack0xfffffffffffffe38,(long)local_14,0,dVar4);
        HTS_Engine_set_gv_interpolation_weight
                  ((HTS_Engine *)&stack0xfffffffffffffe38,(long)local_14,1,dVar4);
        local_10 = local_10 + 1;
      }
      break;
    case 0x6a:
      in_stack_fffffffffffffdcc = (int)*(char *)(*plVar3 + 2);
      if (in_stack_fffffffffffffdcc == 0x66) {
LAB_00101f43:
        dVar4 = atof((char *)local_10[2]);
        HTS_Engine_set_gv_weight((HTS_Engine *)&stack0xfffffffffffffe38,1,dVar4);
      }
      else {
        if (in_stack_fffffffffffffdcc != 0x6d) {
          if (in_stack_fffffffffffffdcc != 0x70) {
            fprintf(_stderr,"Error: Invalid option \'-j%c\'.\n",
                    (ulong)(uint)(int)*(char *)(*plVar3 + 2));
            HTS_Engine_clear(in_stack_fffffffffffffde0);
            exit(1);
          }
          goto LAB_00101f43;
        }
        dVar4 = atof((char *)local_10[2]);
        HTS_Engine_set_gv_weight((HTS_Engine *)&stack0xfffffffffffffe38,0,dVar4);
      }
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
      break;
    case 0x6d:
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
      break;
    case 0x6f:
      in_stack_fffffffffffffdd0 = (HTS_Engine *)(ulong)((int)*(char *)(*plVar3 + 2) - 100);
      switch(in_stack_fffffffffffffdd0) {
      case (HTS_Engine *)0x0:
        __stream_01 = fopen((char *)local_10[2],"wt");
        break;
      default:
        fprintf(_stderr,"Error: Invalid option \'-o%c\'.\n",(ulong)(uint)(int)*(char *)(*plVar3 + 2)
               );
        HTS_Engine_clear(in_stack_fffffffffffffde0);
        exit(1);
      case (HTS_Engine *)0x2:
      case (HTS_Engine *)0xc:
        engine_02 = (HTS_Engine *)fopen((char *)local_10[2],"wb");
        break;
      case (HTS_Engine *)0x8:
        engine_01 = (HTS_Engine *)fopen((char *)local_10[2],"wb");
        break;
      case (HTS_Engine *)0x9:
        local_1f0 = fopen((char *)local_10[2],"wb");
        break;
      case (HTS_Engine *)0xe:
        engine_00 = (HTS_Engine *)fopen((char *)local_10[2],"wb");
        break;
      case (HTS_Engine *)0x10:
        __stream = fopen((char *)local_10[2],"wt");
        break;
      case (HTS_Engine *)0x13:
        __stream_00 = fopen((char *)local_10[2],"wb");
      }
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
      break;
    case 0x70:
      iVar2 = atoi((char *)local_10[2]);
      HTS_Engine_set_fperiod((HTS_Engine *)&stack0xfffffffffffffe38,(long)iVar2);
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
      break;
    case 0x72:
      dVar4 = atof((char *)local_10[2]);
      HTS_Engine_set_speed((HTS_Engine *)&stack0xfffffffffffffe38,dVar4);
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
      break;
    case 0x73:
      atoi((char *)local_10[2]);
      HTS_Engine_set_sampling_frequency
                (in_stack_fffffffffffffdd0,
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
      break;
    case 0x75:
      dVar4 = atof((char *)local_10[2]);
      HTS_Engine_set_msd_threshold((HTS_Engine *)&stack0xfffffffffffffe38,1,dVar4);
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
      break;
    case 0x76:
      if (*(char *)(*plVar3 + 2) != 'p') {
        fprintf(_stderr,"Error: Invalid option \'-v%c\'.\n",(ulong)(uint)(int)*(char *)(*plVar3 + 2)
               );
        HTS_Engine_clear(in_stack_fffffffffffffde0);
        exit(1);
      }
      HTS_Engine_set_phoneme_alignment_flag((HTS_Engine *)&stack0xfffffffffffffe38,'\x01');
      local_10 = plVar3;
      local_8 = iVar2;
      break;
    case 0x7a:
      atoi((char *)local_10[2]);
      HTS_Engine_set_audio_buff_size
                (in_stack_fffffffffffffdd0,
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      local_10 = local_10 + 2;
      local_8 = local_8 + -2;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   int i;
   double f;

   /* hts_engine API */
   HTS_Engine engine;

   /* HTS voices */
   size_t num_voices;
   char **fn_voices;

   /* input label file name */
   char *labfn = NULL;

   /* output file pointers */
   FILE *durfp = NULL, *mgcfp = NULL, *lf0fp = NULL, *lpffp = NULL, *wavfp = NULL, *rawfp = NULL, *tracefp = NULL;

   /* interpolation weights */
   size_t num_interpolation_weights;

   /* output usage */
   if (argc <= 1)
      usage();

   /* initialize hts_engine API */
   HTS_Engine_initialize(&engine);

   /* get HTS voice file names */
   num_voices = 0;
   fn_voices = (char **) malloc(argc * sizeof(char *));
   for (i = 0; i < argc; i++) {
      if (argv[i][0] == '-' && argv[i][1] == 'm')
         fn_voices[num_voices++] = argv[++i];
      if (argv[i][0] == '-' && argv[i][1] == 'h')
         usage();
   }
   if (num_voices == 0) {
      fprintf(stderr, "Error: HTS voice must be specified.\n");
      free(fn_voices);
      exit(1);
   }

   /* load HTS voices */
   if (HTS_Engine_load(&engine, fn_voices, num_voices) != TRUE) {
      fprintf(stderr, "Error: HTS voices cannot be loaded.\n");
      free(fn_voices);
      HTS_Engine_clear(&engine);
      exit(1);
   }
   free(fn_voices);

   /* get options */
   while (--argc) {
      if (**++argv == '-') {
         switch (*(*argv + 1)) {
         case 'v':
            switch (*(*argv + 2)) {
            case 'p':
               HTS_Engine_set_phoneme_alignment_flag(&engine, TRUE);
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-v%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            break;
         case 'o':
            switch (*(*argv + 2)) {
            case 'w':
               wavfp = fopen(*++argv, "wb");
               break;
            case 'r':
               rawfp = fopen(*++argv, "wb");
               break;
            case 'd':
               durfp = fopen(*++argv, "wt");
               break;
            case 'm':
               mgcfp = fopen(*++argv, "wb");
               break;
            case 'f':
            case 'p':
               lf0fp = fopen(*++argv, "wb");
               break;
            case 'l':
               lpffp = fopen(*++argv, "wb");
               break;
            case 't':
               tracefp = fopen(*++argv, "wt");
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-o%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'h':
            usage();
            break;
         case 'm':
            argv++;             /* HTS voices were already loaded */
            --argc;
            break;
         case 's':
            HTS_Engine_set_sampling_frequency(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         case 'p':
            HTS_Engine_set_fperiod(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         case 'a':
            HTS_Engine_set_alpha(&engine, atof(*++argv));
            --argc;
            break;
         case 'b':
            HTS_Engine_set_beta(&engine, atof(*++argv));
            --argc;
            break;
         case 'r':
            HTS_Engine_set_speed(&engine, atof(*++argv));
            --argc;
            break;
         case 'f':
            switch (*(*argv + 2)) {
            case 'm':
               HTS_Engine_add_half_tone(&engine, atof(*++argv));
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-f%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'u':
            HTS_Engine_set_msd_threshold(&engine, 1, atof(*++argv));
            --argc;
            break;
         case 'i':
            num_interpolation_weights = atoi(*++argv);
            argc--;
            if (num_interpolation_weights != num_voices) {
               HTS_Engine_clear(&engine);
               exit(1);
            }
            for (i = 0; i < num_interpolation_weights; i++) {
               f = atof(*++argv);
               argc--;
               HTS_Engine_set_duration_interpolation_weight(&engine, i, f);
               HTS_Engine_set_parameter_interpolation_weight(&engine, i, 0, f);
               HTS_Engine_set_parameter_interpolation_weight(&engine, i, 1, f);
               HTS_Engine_set_gv_interpolation_weight(&engine, i, 0, f);
               HTS_Engine_set_gv_interpolation_weight(&engine, i, 1, f);
            }
            break;
         case 'j':
            switch (*(*argv + 2)) {
            case 'm':
               HTS_Engine_set_gv_weight(&engine, 0, atof(*++argv));
               break;
            case 'f':
            case 'p':
               HTS_Engine_set_gv_weight(&engine, 1, atof(*++argv));
               break;
            default:
               fprintf(stderr, "Error: Invalid option '-j%c'.\n", *(*argv + 2));
               HTS_Engine_clear(&engine);
               exit(1);
            }
            --argc;
            break;
         case 'g':
            HTS_Engine_set_volume(&engine, atof(*++argv));
            --argc;
            break;
         case 'z':
            HTS_Engine_set_audio_buff_size(&engine, (size_t) atoi(*++argv));
            --argc;
            break;
         default:
            fprintf(stderr, "Error: Invalid option '-%c'.\n", *(*argv + 1));
            HTS_Engine_clear(&engine);
            exit(1);
         }
      } else {
         labfn = *argv;
      }
   }

   /* synthesize */
   if (HTS_Engine_synthesize_from_fn(&engine, labfn) != TRUE) {
      fprintf(stderr, "Error: waveform cannot be synthesized.\n");
      HTS_Engine_clear(&engine);
      exit(1);
   }

   /* output */
   if (tracefp != NULL)
      HTS_Engine_save_information(&engine, tracefp);
   if (durfp != NULL)
      HTS_Engine_save_label(&engine, durfp);
   if (rawfp)
      HTS_Engine_save_generated_speech(&engine, rawfp);
   if (wavfp)
      HTS_Engine_save_riff(&engine, wavfp);
   if (mgcfp)
      HTS_Engine_save_generated_parameter(&engine, 0, mgcfp);
   if (lf0fp)
      HTS_Engine_save_generated_parameter(&engine, 1, lf0fp);
   if (lpffp)
      HTS_Engine_save_generated_parameter(&engine, 2, lpffp);

   /* reset */
   HTS_Engine_refresh(&engine);

   /* free memory */
   HTS_Engine_clear(&engine);

   /* close files */
   if (durfp != NULL)
      fclose(durfp);
   if (mgcfp != NULL)
      fclose(mgcfp);
   if (lf0fp != NULL)
      fclose(lf0fp);
   if (lpffp != NULL)
      fclose(lpffp);
   if (wavfp != NULL)
      fclose(wavfp);
   if (rawfp != NULL)
      fclose(rawfp);
   if (tracefp != NULL)
      fclose(tracefp);

   return 0;
}